

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O1

bool __thiscall
yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lockwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  cv_status cVar1;
  bool bVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = (mutex_type *)(this + 0x38);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  do {
    if (*(long *)this == 0) goto LAB_001e657c;
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 8),&local_30,tp);
  } while (cVar1 != timeout);
  if (*(long *)this == 0) {
LAB_001e657c:
    if ((long)*(ulong *)this < 0) {
      __assert_fail("!(s.rwcount & writer_mask)",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_rwlock_sched.hpp"
                    ,0x4a,"static void yamc::rwlock::ReaderPrefer::acquire_wlock(state &)");
    }
    *(ulong *)this = *(ulong *)this | 0x8000000000000000;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar2;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp)
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    RwLockPolicy::before_wait_wlock(state_);
    while (RwLockPolicy::wait_wlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_wlock(state_))  // re-check predicate
          break;
        RwLockPolicy::after_wait_wlock(state_);
        return false;
      }
    }
    RwLockPolicy::after_wait_wlock(state_);
    RwLockPolicy::acquire_wlock(state_);
    return true;
  }